

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1550.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int local_24;
  CURLcode ec;
  int res;
  CURLM *handle;
  char *URL_local;
  
  local_24 = 0;
  iVar1 = curl_global_init(3);
  uVar3 = _stderr;
  if (iVar1 != 0) {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar3,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1550.c"
                  ,0x25,iVar1,uVar2);
    local_24 = iVar1;
  }
  if (local_24 == 0) {
    uVar3 = curl_multi_init();
    curl_multi_setopt(uVar3,0x271c,test::bl_servers);
    curl_multi_setopt(uVar3,0x271b,test::bl_sites);
    curl_multi_cleanup(uVar3);
    curl_global_cleanup();
    URL_local._4_4_ = 0;
  }
  else {
    URL_local._4_4_ = local_24;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURLM *handle;
  int res = CURLE_OK;
  static const char * const bl_servers[] =
     {"Microsoft-IIS/6.0", "nginx/0.8.54", NULL};
  static const char * const bl_sites[] =
     {"curl.haxx.se:443", "example.com:80", NULL};

  global_init(CURL_GLOBAL_ALL);
  handle = curl_multi_init();
  (void)URL; /* unused */

  curl_multi_setopt(handle, CURLMOPT_PIPELINING_SERVER_BL, bl_servers);
  curl_multi_setopt(handle, CURLMOPT_PIPELINING_SITE_BL, bl_sites);
  curl_multi_cleanup(handle);
  curl_global_cleanup();
  return 0;
}